

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_imaging(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_imaging != 0) {
    glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*load)("glBlendColor");
    glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*load)("glBlendEquation");
    glad_glColorTable = (PFNGLCOLORTABLEPROC)(*load)("glColorTable");
    glad_glColorTableParameterfv =
         (PFNGLCOLORTABLEPARAMETERFVPROC)(*load)("glColorTableParameterfv");
    glad_glColorTableParameteriv =
         (PFNGLCOLORTABLEPARAMETERIVPROC)(*load)("glColorTableParameteriv");
    glad_glCopyColorTable = (PFNGLCOPYCOLORTABLEPROC)(*load)("glCopyColorTable");
    glad_glGetColorTable = (PFNGLGETCOLORTABLEPROC)(*load)("glGetColorTable");
    glad_glGetColorTableParameterfv =
         (PFNGLGETCOLORTABLEPARAMETERFVPROC)(*load)("glGetColorTableParameterfv");
    glad_glGetColorTableParameteriv =
         (PFNGLGETCOLORTABLEPARAMETERIVPROC)(*load)("glGetColorTableParameteriv");
    glad_glColorSubTable = (PFNGLCOLORSUBTABLEPROC)(*load)("glColorSubTable");
    glad_glCopyColorSubTable = (PFNGLCOPYCOLORSUBTABLEPROC)(*load)("glCopyColorSubTable");
    glad_glConvolutionFilter1D = (PFNGLCONVOLUTIONFILTER1DPROC)(*load)("glConvolutionFilter1D");
    glad_glConvolutionFilter2D = (PFNGLCONVOLUTIONFILTER2DPROC)(*load)("glConvolutionFilter2D");
    glad_glConvolutionParameterf =
         (PFNGLCONVOLUTIONPARAMETERFPROC)(*load)("glConvolutionParameterf");
    glad_glConvolutionParameterfv =
         (PFNGLCONVOLUTIONPARAMETERFVPROC)(*load)("glConvolutionParameterfv");
    glad_glConvolutionParameteri =
         (PFNGLCONVOLUTIONPARAMETERIPROC)(*load)("glConvolutionParameteri");
    glad_glConvolutionParameteriv =
         (PFNGLCONVOLUTIONPARAMETERIVPROC)(*load)("glConvolutionParameteriv");
    glad_glCopyConvolutionFilter1D =
         (PFNGLCOPYCONVOLUTIONFILTER1DPROC)(*load)("glCopyConvolutionFilter1D");
    glad_glCopyConvolutionFilter2D =
         (PFNGLCOPYCONVOLUTIONFILTER2DPROC)(*load)("glCopyConvolutionFilter2D");
    glad_glGetConvolutionFilter = (PFNGLGETCONVOLUTIONFILTERPROC)(*load)("glGetConvolutionFilter");
    glad_glGetConvolutionParameterfv =
         (PFNGLGETCONVOLUTIONPARAMETERFVPROC)(*load)("glGetConvolutionParameterfv");
    glad_glGetConvolutionParameteriv =
         (PFNGLGETCONVOLUTIONPARAMETERIVPROC)(*load)("glGetConvolutionParameteriv");
    glad_glGetSeparableFilter = (PFNGLGETSEPARABLEFILTERPROC)(*load)("glGetSeparableFilter");
    glad_glSeparableFilter2D = (PFNGLSEPARABLEFILTER2DPROC)(*load)("glSeparableFilter2D");
    glad_glGetHistogram = (PFNGLGETHISTOGRAMPROC)(*load)("glGetHistogram");
    glad_glGetHistogramParameterfv =
         (PFNGLGETHISTOGRAMPARAMETERFVPROC)(*load)("glGetHistogramParameterfv");
    glad_glGetHistogramParameteriv =
         (PFNGLGETHISTOGRAMPARAMETERIVPROC)(*load)("glGetHistogramParameteriv");
    glad_glGetMinmax = (PFNGLGETMINMAXPROC)(*load)("glGetMinmax");
    glad_glGetMinmaxParameterfv = (PFNGLGETMINMAXPARAMETERFVPROC)(*load)("glGetMinmaxParameterfv");
    glad_glGetMinmaxParameteriv = (PFNGLGETMINMAXPARAMETERIVPROC)(*load)("glGetMinmaxParameteriv");
    glad_glHistogram = (PFNGLHISTOGRAMPROC)(*load)("glHistogram");
    glad_glMinmax = (PFNGLMINMAXPROC)(*load)("glMinmax");
    glad_glResetHistogram = (PFNGLRESETHISTOGRAMPROC)(*load)("glResetHistogram");
    glad_glResetMinmax = (PFNGLRESETMINMAXPROC)(*load)("glResetMinmax");
  }
  return;
}

Assistant:

static void load_GL_ARB_imaging(GLADloadproc load) {
	if(!GLAD_GL_ARB_imaging) return;
	glad_glBlendColor = (PFNGLBLENDCOLORPROC)load("glBlendColor");
	glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)load("glBlendEquation");
	glad_glColorTable = (PFNGLCOLORTABLEPROC)load("glColorTable");
	glad_glColorTableParameterfv = (PFNGLCOLORTABLEPARAMETERFVPROC)load("glColorTableParameterfv");
	glad_glColorTableParameteriv = (PFNGLCOLORTABLEPARAMETERIVPROC)load("glColorTableParameteriv");
	glad_glCopyColorTable = (PFNGLCOPYCOLORTABLEPROC)load("glCopyColorTable");
	glad_glGetColorTable = (PFNGLGETCOLORTABLEPROC)load("glGetColorTable");
	glad_glGetColorTableParameterfv = (PFNGLGETCOLORTABLEPARAMETERFVPROC)load("glGetColorTableParameterfv");
	glad_glGetColorTableParameteriv = (PFNGLGETCOLORTABLEPARAMETERIVPROC)load("glGetColorTableParameteriv");
	glad_glColorSubTable = (PFNGLCOLORSUBTABLEPROC)load("glColorSubTable");
	glad_glCopyColorSubTable = (PFNGLCOPYCOLORSUBTABLEPROC)load("glCopyColorSubTable");
	glad_glConvolutionFilter1D = (PFNGLCONVOLUTIONFILTER1DPROC)load("glConvolutionFilter1D");
	glad_glConvolutionFilter2D = (PFNGLCONVOLUTIONFILTER2DPROC)load("glConvolutionFilter2D");
	glad_glConvolutionParameterf = (PFNGLCONVOLUTIONPARAMETERFPROC)load("glConvolutionParameterf");
	glad_glConvolutionParameterfv = (PFNGLCONVOLUTIONPARAMETERFVPROC)load("glConvolutionParameterfv");
	glad_glConvolutionParameteri = (PFNGLCONVOLUTIONPARAMETERIPROC)load("glConvolutionParameteri");
	glad_glConvolutionParameteriv = (PFNGLCONVOLUTIONPARAMETERIVPROC)load("glConvolutionParameteriv");
	glad_glCopyConvolutionFilter1D = (PFNGLCOPYCONVOLUTIONFILTER1DPROC)load("glCopyConvolutionFilter1D");
	glad_glCopyConvolutionFilter2D = (PFNGLCOPYCONVOLUTIONFILTER2DPROC)load("glCopyConvolutionFilter2D");
	glad_glGetConvolutionFilter = (PFNGLGETCONVOLUTIONFILTERPROC)load("glGetConvolutionFilter");
	glad_glGetConvolutionParameterfv = (PFNGLGETCONVOLUTIONPARAMETERFVPROC)load("glGetConvolutionParameterfv");
	glad_glGetConvolutionParameteriv = (PFNGLGETCONVOLUTIONPARAMETERIVPROC)load("glGetConvolutionParameteriv");
	glad_glGetSeparableFilter = (PFNGLGETSEPARABLEFILTERPROC)load("glGetSeparableFilter");
	glad_glSeparableFilter2D = (PFNGLSEPARABLEFILTER2DPROC)load("glSeparableFilter2D");
	glad_glGetHistogram = (PFNGLGETHISTOGRAMPROC)load("glGetHistogram");
	glad_glGetHistogramParameterfv = (PFNGLGETHISTOGRAMPARAMETERFVPROC)load("glGetHistogramParameterfv");
	glad_glGetHistogramParameteriv = (PFNGLGETHISTOGRAMPARAMETERIVPROC)load("glGetHistogramParameteriv");
	glad_glGetMinmax = (PFNGLGETMINMAXPROC)load("glGetMinmax");
	glad_glGetMinmaxParameterfv = (PFNGLGETMINMAXPARAMETERFVPROC)load("glGetMinmaxParameterfv");
	glad_glGetMinmaxParameteriv = (PFNGLGETMINMAXPARAMETERIVPROC)load("glGetMinmaxParameteriv");
	glad_glHistogram = (PFNGLHISTOGRAMPROC)load("glHistogram");
	glad_glMinmax = (PFNGLMINMAXPROC)load("glMinmax");
	glad_glResetHistogram = (PFNGLRESETHISTOGRAMPROC)load("glResetHistogram");
	glad_glResetMinmax = (PFNGLRESETMINMAXPROC)load("glResetMinmax");
}